

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void raviX_show_linearizer(LinearizerState *linearizer,TextBuffer *mb)

{
  undefined1 local_38 [8];
  PtrListIterator prociter__;
  Proc *proc;
  TextBuffer *mb_local;
  LinearizerState *linearizer_local;
  
  output_proc(linearizer->main_proc,mb);
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_38,(PtrList *)linearizer->all_procs);
  prociter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_38);
  while (prociter__._16_8_ != 0) {
    if ((Proc *)prociter__._16_8_ != linearizer->main_proc) {
      output_proc((Proc *)prociter__._16_8_,mb);
    }
    prociter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_38);
  }
  return;
}

Assistant:

void raviX_show_linearizer(LinearizerState *linearizer, TextBuffer *mb)
{
	output_proc(linearizer->main_proc, mb);
	Proc *proc;
	FOR_EACH_PTR(linearizer->all_procs, Proc, proc)
	{
		if (proc == linearizer->main_proc)
			continue;
		output_proc(proc, mb);
	}
	END_FOR_EACH_PTR(proc)
}